

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O0

fdb_status fdb_get_kvs_info(fdb_kvs_handle *handle,fdb_kvs_info *info)

{
  kvs_header *pkVar1;
  bool bVar2;
  avl_node *paVar3;
  long lVar4;
  undefined8 *in_RSI;
  fdb_kvs_handle *in_RDI;
  kvs_stat stat;
  kvs_header *kv_header;
  kvs_node query;
  kvs_node *node;
  filemgr *file;
  avl_node *a;
  fdb_kvs_id_t kv_id;
  uint64_t nlivenodes;
  uint64_t datasize;
  uint64_t wal_n_inserts;
  uint64_t wal_deletes;
  uint64_t wal_docs;
  uint64_t ndeletes;
  uint64_t ndocs;
  undefined6 in_stack_fffffffffffffe78;
  uint8_t in_stack_fffffffffffffe7e;
  uint8_t in_stack_fffffffffffffe7f;
  snap_handle *in_stack_fffffffffffffe80;
  fdb_kvs_handle *in_stack_fffffffffffffe88;
  filemgr *in_stack_fffffffffffffe90;
  avl_tree *in_stack_fffffffffffffe98;
  long local_160;
  avl_cmp_func *local_158;
  fdb_kvs_handle *in_stack_ffffffffffffff28;
  fdb_status local_4;
  
  if (in_RDI == (fdb_kvs_handle *)0x0) {
    local_4 = FDB_RESULT_INVALID_HANDLE;
  }
  else if (in_RSI == (undefined8 *)0x0) {
    local_4 = FDB_RESULT_INVALID_ARGS;
  }
  else {
    bVar2 = atomic_cas_uint8_t((atomic<unsigned_char> *)in_stack_fffffffffffffe80,
                               in_stack_fffffffffffffe7f,in_stack_fffffffffffffe7e);
    if (bVar2) {
      if (in_RDI->shandle == (snap_handle *)0x0) {
        fdb_check_file_reopen(in_RDI,(file_status_t *)0x0);
        fdb_sync_db_header(in_stack_ffffffffffffff28);
      }
      if (in_RDI->kvs == (kvs_info *)0x0) {
        *in_RSI = default_kvs_name;
      }
      else {
        pkVar1 = in_RDI->file->kv_header;
        pthread_spin_lock(&pkVar1->lock);
        paVar3 = avl_search(in_stack_fffffffffffffe98,(avl_node *)in_stack_fffffffffffffe90,
                            (avl_cmp_func *)in_stack_fffffffffffffe88);
        if (paVar3 == (avl_node *)0x0) {
          *in_RSI = default_kvs_name;
        }
        else {
          *in_RSI = paVar3[-8].left;
        }
        pthread_spin_unlock(&pkVar1->lock);
      }
      if (in_RDI->shandle == (snap_handle *)0x0) {
        _kvs_stat_get(in_stack_fffffffffffffe90,(fdb_kvs_id_t)in_stack_fffffffffffffe88,
                      (kvs_stat *)in_stack_fffffffffffffe80);
      }
      else {
        snap_get_stat(in_stack_fffffffffffffe80,
                      (kvs_stat *)
                      CONCAT17(in_stack_fffffffffffffe7f,
                               CONCAT16(in_stack_fffffffffffffe7e,in_stack_fffffffffffffe78)));
      }
      lVar4 = local_160 - (long)local_158;
      if ((avl_cmp_func *)((long)in_stack_fffffffffffffe88 + lVar4) < local_158) {
        in_RSI[2] = 0;
      }
      else if (in_stack_fffffffffffffe88 == (fdb_kvs_handle *)0x0) {
        in_RSI[2] = lVar4;
      }
      else {
        in_RSI[2] = (avl_cmp_func *)((long)in_stack_fffffffffffffe88 + (lVar4 - (long)local_158));
      }
      if (in_stack_fffffffffffffe90 == (filemgr *)0x0) {
        in_RSI[3] = local_158;
      }
      else {
        in_RSI[3] = local_158 + (long)&in_stack_fffffffffffffe90->filename;
      }
      in_RSI[4] = in_stack_fffffffffffffe98;
      in_RSI[4] = (long)in_stack_fffffffffffffe80 * (ulong)(in_RDI->config).blocksize + in_RSI[4];
      in_RSI[5] = in_RDI->fhandle;
      atomic_cas_uint8_t((atomic<unsigned_char> *)in_stack_fffffffffffffe80,
                         in_stack_fffffffffffffe7f,in_stack_fffffffffffffe7e);
      fdb_get_kvs_seqnum(in_stack_fffffffffffffe88,(fdb_seqnum_t *)in_stack_fffffffffffffe80);
      local_4 = FDB_RESULT_SUCCESS;
    }
    else {
      local_4 = FDB_RESULT_HANDLE_BUSY;
    }
  }
  return local_4;
}

Assistant:

LIBFDB_API
fdb_status fdb_get_kvs_info(fdb_kvs_handle *handle, fdb_kvs_info *info)
{
    uint64_t ndocs;
    uint64_t ndeletes;
    uint64_t wal_docs;
    uint64_t wal_deletes;
    uint64_t wal_n_inserts;
    uint64_t datasize;
    uint64_t nlivenodes;
    fdb_kvs_id_t kv_id;
    struct avl_node *a;
    struct filemgr *file;
    struct kvs_node *node, query;
    struct kvs_header *kv_header;
    struct kvs_stat stat;

    if (!handle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    if (!info) {
        return FDB_RESULT_INVALID_ARGS;
    }

    if (!atomic_cas_uint8_t(&handle->handle_busy, 0, 1)) {
        return FDB_RESULT_HANDLE_BUSY;
    }

    if (!handle->shandle) { // snapshot handle should be immutable
        fdb_check_file_reopen(handle, NULL);
        fdb_sync_db_header(handle);
    }

    file = handle->file;

    if (handle->kvs == NULL) {
        info->name = default_kvs_name;
        kv_id = 0;

    } else {
        kv_header = file->kv_header;
        kv_id = handle->kvs->id;
        spin_lock(&kv_header->lock);

        query.id = handle->kvs->id;
        a = avl_search(kv_header->idx_id, &query.avl_id, _kvs_cmp_id);
        if (a) { // sub handle
            node = _get_entry(a, struct kvs_node, avl_id);
            info->name = (const char*)node->kvs_name;
        } else { // root handle
            info->name = default_kvs_name;
        }
        spin_unlock(&kv_header->lock);
    }

    if (handle->shandle) {
        // snapshot .. get its local stats
        snap_get_stat(handle->shandle, &stat);
    } else {
        _kvs_stat_get(file, kv_id, &stat);
    }
    ndocs = stat.ndocs;
    ndeletes = stat.ndeletes;
    wal_docs = stat.wal_ndocs;
    wal_deletes = stat.wal_ndeletes;
    wal_n_inserts = wal_docs - wal_deletes;

    if (ndocs + wal_n_inserts < wal_deletes) {
        info->doc_count = 0;
    } else {
        if (ndocs) { // not accurate since some ndocs may be in wal_n_inserts
            info->doc_count = ndocs + wal_n_inserts - wal_deletes;
        } else { // this is accurate
            info->doc_count = wal_n_inserts;
        }
    }

    if (ndeletes) { // not accurate since some ndeletes may be wal_n_deletes
        info->deleted_count = ndeletes + wal_deletes;
    } else { // this is accurate
        info->deleted_count = wal_deletes;
    }

    datasize = stat.datasize;
    nlivenodes = stat.nlivenodes;

    info->space_used = datasize;
    info->space_used += nlivenodes * handle->config.blocksize;
    info->file = handle->fhandle;

    atomic_cas_uint8_t(&handle->handle_busy, 1, 0);

    // This is another LIBFDB_API call, so handle is marked as free
    // in the line above before making this call
    fdb_get_kvs_seqnum(handle, &info->last_seqnum);

    return FDB_RESULT_SUCCESS;
}